

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O2

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>::
ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>
          (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>> *this,
          EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *matrix)

{
  long local_20;
  
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,3,3);
  local_20 = 3;
  Matrix<double,_3,_1,_0,_3,_1>::Matrix<long>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x48),&local_20);
  PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)(this + 0x60),3);
  PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_> *)(this + 0x70),3);
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)(this + 0x88),3);
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)(this + 0xa0),3);
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)(this + 0xb8),3);
  *(undefined2 *)(this + 0xd0) = 0;
  compute<Eigen::Matrix<double,3,3,0,3,3>>(this,matrix);
  return;
}

Assistant:

explicit ColPivHouseholderQR(const EigenBase<InputType>& matrix)
      : m_qr(matrix.rows(), matrix.cols()),
        m_hCoeffs((std::min)(matrix.rows(),matrix.cols())),
        m_colsPermutation(PermIndexType(matrix.cols())),
        m_colsTranspositions(matrix.cols()),
        m_temp(matrix.cols()),
        m_colNormsUpdated(matrix.cols()),
        m_colNormsDirect(matrix.cols()),
        m_isInitialized(false),
        m_usePrescribedThreshold(false)
    {
      compute(matrix.derived());
    }